

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::buildForwardTable(RBBITableBuilder *this)

{
  UBool UVar1;
  RBBINode *pRVar2;
  void *in_RSI;
  RBBINode *local_c8;
  RBBINode *local_b8;
  RBBINode *local_98;
  RBBINode *local_88;
  RBBINode *cn;
  RBBINode *bofLeaf;
  RBBINode *bofTop;
  RBBITableBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*this->fStatus);
  if ((UVar1 == '\0') && (*this->fTree != (RBBINode *)0x0)) {
    pRVar2 = RBBINode::flattenVariables(*this->fTree);
    *this->fTree = pRVar2;
    UVar1 = RBBISetBuilder::sawBOF(this->fRB->fSetBuilder);
    if (UVar1 != '\0') {
      pRVar2 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
      local_88 = (RBBINode *)0x0;
      if (pRVar2 != (RBBINode *)0x0) {
        in_RSI = (void *)0x8;
        RBBINode::RBBINode(pRVar2,opCat);
        local_88 = pRVar2;
      }
      pRVar2 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
      local_98 = (RBBINode *)0x0;
      if (pRVar2 != (RBBINode *)0x0) {
        in_RSI = (void *)0x3;
        RBBINode::RBBINode(pRVar2,leafChar);
        local_98 = pRVar2;
      }
      if ((local_88 == (RBBINode *)0x0) || (local_98 == (RBBINode *)0x0)) {
        *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
        if (local_88 != (RBBINode *)0x0) {
          RBBINode::~RBBINode(local_88);
          UMemory::operator_delete((UMemory *)local_88,in_RSI);
        }
        if (local_98 == (RBBINode *)0x0) {
          return;
        }
        RBBINode::~RBBINode(local_98);
        UMemory::operator_delete((UMemory *)local_98,in_RSI);
        return;
      }
      local_88->fLeftChild = local_98;
      local_88->fRightChild = *this->fTree;
      local_98->fParent = local_88;
      local_98->fVal = 2;
      *this->fTree = local_88;
    }
    pRVar2 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
    local_b8 = (RBBINode *)0x0;
    if (pRVar2 != (RBBINode *)0x0) {
      in_RSI = (void *)0x8;
      RBBINode::RBBINode(pRVar2,opCat);
      local_b8 = pRVar2;
    }
    if (local_b8 == (RBBINode *)0x0) {
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      local_b8->fLeftChild = *this->fTree;
      (*this->fTree)->fParent = local_b8;
      pRVar2 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
      local_c8 = (RBBINode *)0x0;
      if (pRVar2 != (RBBINode *)0x0) {
        in_RSI = (void *)0x6;
        RBBINode::RBBINode(pRVar2,endMark);
        local_c8 = pRVar2;
      }
      local_b8->fRightChild = local_c8;
      if (local_b8->fRightChild == (RBBINode *)0x0) {
        *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
        if (local_b8 != (RBBINode *)0x0) {
          RBBINode::~RBBINode(local_b8);
          UMemory::operator_delete((UMemory *)local_b8,in_RSI);
        }
      }
      else {
        local_b8->fRightChild->fParent = local_b8;
        *this->fTree = local_b8;
        RBBINode::flattenSets(*this->fTree);
        calcNullable(this,*this->fTree);
        calcFirstPos(this,*this->fTree);
        calcLastPos(this,*this->fTree);
        calcFollowPos(this,*this->fTree);
        if (this->fRB->fDebugEnv != (char *)0x0) {
          strstr(this->fRB->fDebugEnv,"pos");
        }
        if (this->fRB->fChainRules != '\0') {
          calcChainedFollowPos(this,*this->fTree);
        }
        UVar1 = RBBISetBuilder::sawBOF(this->fRB->fSetBuilder);
        if (UVar1 != '\0') {
          bofFixup(this);
        }
        buildStateTable(this);
        flagAcceptingStates(this);
        flagLookAheadStates(this);
        flagTaggedStates(this);
        mergeRuleStatusVals(this);
      }
    }
  }
  return;
}

Assistant:

void  RBBITableBuilder::buildForwardTable() {

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // If there were no rules, just return.  This situation can easily arise
    //   for the reverse rules.
    if (fTree==NULL) {
        return;
    }

    //
    // Walk through the tree, replacing any references to $variables with a copy of the
    //   parse tree for the substition expression.
    //
    fTree = fTree->flattenVariables();
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "ftree")) {
        RBBIDebugPuts("\nParse tree after flattening variable references.");
        RBBINode::printTree(fTree, TRUE);
    }
#endif

    //
    // If the rules contained any references to {bof} 
    //   add a {bof} <cat> <former root of tree> to the
    //   tree.  Means that all matches must start out with the 
    //   {bof} fake character.
    // 
    if (fRB->fSetBuilder->sawBOF()) {
        RBBINode *bofTop    = new RBBINode(RBBINode::opCat);
        RBBINode *bofLeaf   = new RBBINode(RBBINode::leafChar);
        // Delete and exit if memory allocation failed.
        if (bofTop == NULL || bofLeaf == NULL) {
            *fStatus = U_MEMORY_ALLOCATION_ERROR;
            delete bofTop;
            delete bofLeaf;
            return;
        }
        bofTop->fLeftChild  = bofLeaf;
        bofTop->fRightChild = fTree;
        bofLeaf->fParent    = bofTop;
        bofLeaf->fVal       = 2;      // Reserved value for {bof}.
        fTree               = bofTop;
    }

    //
    // Add a unique right-end marker to the expression.
    //   Appears as a cat-node, left child being the original tree,
    //   right child being the end marker.
    //
    RBBINode *cn = new RBBINode(RBBINode::opCat);
    // Exit if memory allocation failed.
    if (cn == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    cn->fLeftChild = fTree;
    fTree->fParent = cn;
    cn->fRightChild = new RBBINode(RBBINode::endMark);
    // Delete and exit if memory allocation failed.
    if (cn->fRightChild == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        delete cn;
        return;
    }
    cn->fRightChild->fParent = cn;
    fTree = cn;

    //
    //  Replace all references to UnicodeSets with the tree for the equivalent
    //      expression.
    //
    fTree->flattenSets();
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "stree")) {
        RBBIDebugPuts("\nParse tree after flattening Unicode Set references.");
        RBBINode::printTree(fTree, TRUE);
    }
#endif


    //
    // calculate the functions nullable, firstpos, lastpos and followpos on
    // nodes in the parse tree.
    //    See the alogrithm description in Aho.
    //    Understanding how this works by looking at the code alone will be
    //       nearly impossible.
    //
    calcNullable(fTree);
    calcFirstPos(fTree);
    calcLastPos(fTree);
    calcFollowPos(fTree);
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "pos")) {
        RBBIDebugPuts("\n");
        printPosSets(fTree);
    }

    //
    //  For "chained" rules, modify the followPos sets
    //
    if (fRB->fChainRules) {
        calcChainedFollowPos(fTree);
    }

    //
    //  BOF (start of input) test fixup.
    //
    if (fRB->fSetBuilder->sawBOF()) {
        bofFixup();
    }

    //
    // Build the DFA state transition tables.
    //
    buildStateTable();
    flagAcceptingStates();
    flagLookAheadStates();
    flagTaggedStates();

    //
    // Update the global table of rule status {tag} values
    // The rule builder has a global vector of status values that are common
    //    for all tables.  Merge the ones from this table into the global set.
    //
    mergeRuleStatusVals();
}